

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_sha1_write(fio_sha1_s *s,void *data,size_t len)

{
  ulong uVar1;
  ulong __n;
  size_t partial;
  size_t in_buffer;
  size_t len_local;
  void *data_local;
  fio_sha1_s *s_local;
  
  uVar1 = s->length & 0x3f;
  __n = 0x40 - uVar1;
  s->length = len + s->length;
  if (len < __n) {
    memcpy(s->buffer + uVar1,data,len);
  }
  else {
    in_buffer = len;
    len_local = (size_t)data;
    if (uVar1 != 0) {
      memcpy(s->buffer + uVar1,data,__n);
      in_buffer = len - __n;
      len_local = (long)data + __n;
      fio_sha1_perform_all_rounds(s,s->buffer);
    }
    for (; 0x3f < in_buffer; in_buffer = in_buffer - 0x40) {
      fio_sha1_perform_all_rounds(s,(uint8_t *)len_local);
      len_local = len_local + 0x40;
    }
    if (in_buffer != 0) {
      memcpy(s->buffer + uVar1,(void *)len_local,in_buffer);
    }
  }
  return;
}

Assistant:

void fio_sha1_write(fio_sha1_s *s, const void *data, size_t len) {
  size_t in_buffer = s->length & 63;
  size_t partial = 64 - in_buffer;
  s->length += len;
  if (partial > len) {
    memcpy(s->buffer + in_buffer, data, len);
    return;
  }
  if (in_buffer) {
    memcpy(s->buffer + in_buffer, data, partial);
    len -= partial;
    data = (void *)((uintptr_t)data + partial);
    fio_sha1_perform_all_rounds(s, s->buffer);
  }
  while (len >= 64) {
    fio_sha1_perform_all_rounds(s, data);
    data = (void *)((uintptr_t)data + 64);
    len -= 64;
  }
  if (len) {
    memcpy(s->buffer + in_buffer, data, len);
  }
  return;
}